

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

bool __thiscall ClipperLib::Clipper::FixupIntersectionOrder(Clipper *this)

{
  IntersectNode **ppIVar1;
  __normal_iterator<ClipperLib::IntersectNode_**,_std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>_>
  __first;
  __normal_iterator<ClipperLib::IntersectNode_**,_std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>_>
  __last;
  IntersectNode *pIVar2;
  IntersectNode *pIVar3;
  long lVar4;
  pointer ppIVar5;
  IntersectNode **ppIVar6;
  ulong uVar7;
  __normal_iterator<ClipperLib::IntersectNode_**,_std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>_>
  _Var8;
  ulong uVar9;
  ulong uVar10;
  TEdge *pTVar11;
  value_type __val;
  IntersectNode **ppIVar12;
  ulong uVar13;
  TEdge *pTVar14;
  ulong uVar15;
  size_t __n;
  ulong uVar16;
  __normal_iterator<ClipperLib::IntersectNode_**,_std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>_>
  __i;
  IntersectNode **ppIVar17;
  long lVar18;
  ulong uVar19;
  value_type __val_2;
  bool bVar20;
  
  pTVar14 = *(TEdge **)
             (this->_vptr_Clipper[-3] + 0x10 +
             (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
  this->m_SortedEdges = pTVar14;
  while (pTVar14 != (TEdge *)0x0) {
    pTVar14->PrevInSEL = pTVar14->PrevInAEL;
    pTVar14->NextInSEL = pTVar14->NextInAEL;
    pTVar14 = pTVar14->NextInAEL;
  }
  __first._M_current =
       (this->m_IntersectList).
       super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->m_IntersectList).
       super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar7 = (long)__last._M_current - (long)__first._M_current >> 3;
    lVar18 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<ClipperLib::IntersectNode**,std::vector<ClipperLib::IntersectNode*,std::allocator<ClipperLib::IntersectNode*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(ClipperLib::IntersectNode*,ClipperLib::IntersectNode*)>>
              (__first,__last,(ulong)(((uint)lVar18 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(ClipperLib::IntersectNode_*,_ClipperLib::IntersectNode_*)>)
               IntersectListSort);
    ppIVar17 = __first._M_current + 1;
    _Var8._M_current = __first._M_current;
    if ((long)__last._M_current - (long)__first._M_current < 0x81) {
      for (; ppIVar17 != __last._M_current; ppIVar17 = ppIVar17 + 1) {
        pIVar2 = *ppIVar17;
        lVar18 = (pIVar2->Pt).Y;
        if (((*__first._M_current)->Pt).Y < lVar18) {
          memmove((void *)((long)_Var8._M_current +
                          (0x10 - ((long)ppIVar17 - (long)__first._M_current))),__first._M_current,
                  (long)ppIVar17 - (long)__first._M_current);
          _Var8._M_current = __first._M_current;
        }
        else {
          pIVar3 = *_Var8._M_current;
          lVar4 = (pIVar3->Pt).Y;
          _Var8._M_current = ppIVar17;
          while (lVar4 < lVar18) {
            *_Var8._M_current = pIVar3;
            pIVar3 = _Var8._M_current[-2];
            _Var8._M_current = _Var8._M_current + -1;
            lVar4 = (pIVar3->Pt).Y;
          }
        }
        *_Var8._M_current = pIVar2;
        _Var8._M_current = ppIVar17;
      }
    }
    else {
      __n = 8;
      ppIVar12 = ppIVar17;
      do {
        ppIVar1 = __first._M_current + __n;
        pIVar2 = *(IntersectNode **)((long)__first._M_current + __n);
        lVar18 = (pIVar2->Pt).Y;
        if (((*__first._M_current)->Pt).Y < lVar18) {
          memmove(ppIVar17,__first._M_current,__n);
          _Var8._M_current = __first._M_current;
        }
        else {
          pIVar3 = *_Var8._M_current;
          lVar4 = (pIVar3->Pt).Y;
          _Var8._M_current = ppIVar1;
          ppIVar6 = ppIVar12;
          while (lVar4 < lVar18) {
            *ppIVar6 = pIVar3;
            pIVar3 = ppIVar6[-2];
            _Var8._M_current = ppIVar6 + -1;
            ppIVar6 = _Var8._M_current;
            lVar4 = (pIVar3->Pt).Y;
          }
        }
        *_Var8._M_current = pIVar2;
        __n = __n + 8;
        ppIVar12 = ppIVar12 + 1;
        _Var8._M_current = ppIVar1;
      } while (__n != 0x80);
      for (ppIVar17 = __first._M_current + 0x10; ppIVar17 != __last._M_current;
          ppIVar17 = ppIVar17 + 1) {
        pIVar2 = ppIVar17[-1];
        pIVar3 = *ppIVar17;
        lVar18 = (pIVar3->Pt).Y;
        lVar4 = (pIVar2->Pt).Y;
        ppIVar12 = ppIVar17;
        while (lVar4 < lVar18) {
          *ppIVar12 = pIVar2;
          pIVar2 = ppIVar12[-2];
          ppIVar12 = ppIVar12 + -1;
          lVar4 = (pIVar2->Pt).Y;
        }
        *ppIVar12 = pIVar3;
      }
    }
  }
  lVar18 = (long)(this->m_IntersectList).
                 super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_IntersectList).
                 super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar18 == 0) {
    bVar20 = true;
  }
  else {
    uVar19 = lVar18 >> 3;
    uVar7 = 1;
    bVar20 = false;
    uVar16 = 0;
    do {
      uVar15 = uVar7;
      if (uVar7 < uVar19) {
        uVar15 = uVar19;
      }
      ppIVar5 = (this->m_IntersectList).
                super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pIVar2 = ppIVar5[uVar16];
      pTVar14 = pIVar2->Edge1;
      pTVar11 = pIVar2->Edge2;
      if ((pTVar14->NextInSEL != pTVar11) &&
         (uVar9 = uVar16, uVar13 = uVar7, pTVar14->PrevInSEL != pTVar11)) {
        do {
          uVar10 = uVar15;
          if (uVar19 <= uVar13) break;
          pTVar14 = ppIVar5[uVar13]->Edge1;
          pTVar11 = ppIVar5[uVar13]->Edge2;
          uVar10 = uVar13;
          if (pTVar14->NextInSEL == pTVar11) break;
          uVar10 = uVar9 + 1;
          uVar9 = uVar10;
          uVar13 = uVar13 + 1;
        } while (pTVar14->PrevInSEL != pTVar11);
        if (uVar10 == uVar19) {
          return bVar20;
        }
        ppIVar5[uVar16] = ppIVar5[uVar10];
        ppIVar5[uVar10] = pIVar2;
        pIVar2 = (this->m_IntersectList).
                 super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar16];
        pTVar14 = pIVar2->Edge1;
        pTVar11 = pIVar2->Edge2;
      }
      SwapPositionsInSEL(this,pTVar14,pTVar11);
      uVar16 = uVar16 + 1;
      bVar20 = uVar19 <= uVar16;
      uVar7 = uVar7 + 1;
    } while (uVar16 != uVar19 + (uVar19 == 0));
  }
  return bVar20;
}

Assistant:

bool Clipper::FixupIntersectionOrder()
{
  //pre-condition: intersections are sorted Bottom-most first.
  //Now it's crucial that intersections are made only between adjacent edges,
  //so to ensure this the order of intersections may need adjusting ...
  CopyAELToSEL();
  std::sort(m_IntersectList.begin(), m_IntersectList.end(), IntersectListSort);
  size_t cnt = m_IntersectList.size();
  for (size_t i = 0; i < cnt; ++i) 
  {
    if (!EdgesAdjacent(*m_IntersectList[i]))
    {
      size_t j = i + 1;
      while (j < cnt && !EdgesAdjacent(*m_IntersectList[j])) j++;
      if (j == cnt)  return false;
      std::swap(m_IntersectList[i], m_IntersectList[j]);
    }
    SwapPositionsInSEL(m_IntersectList[i]->Edge1, m_IntersectList[i]->Edge2);
  }
  return true;
}